

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JavascriptLibrary.cpp
# Opt level: O0

bool Js::JavascriptLibrary::InitializeProxyConstructor
               (DynamicObject *proxyConstructor,DeferredTypeHandlerBase *typeHandler,
               DeferredInitializeMode mode)

{
  JavascriptLibrary *this;
  ScriptContext *this_00;
  Var value;
  PropertyString *value_00;
  ScriptContext *scriptContext;
  JavascriptLibrary *library;
  DeferredInitializeMode mode_local;
  DeferredTypeHandlerBase *typeHandler_local;
  DynamicObject *proxyConstructor_local;
  
  DeferredTypeHandlerBase::Convert(typeHandler,proxyConstructor,mode,4,0);
  this = RecyclableObject::GetLibrary(&proxyConstructor->super_RecyclableObject);
  this_00 = RecyclableObject::GetScriptContext(&proxyConstructor->super_RecyclableObject);
  value = TaggedInt::ToVarUnchecked(2);
  AddMember(this,proxyConstructor,0xd1,value,'\x02');
  value_00 = ScriptContext::GetPropertyString(this_00,0x126);
  AddMember(this,proxyConstructor,0x106,value_00,'\x02');
  AddFunctionToLibraryObject
            (this,proxyConstructor,0x137,(FunctionInfo *)Js::JavascriptProxy::EntryInfo::Revocable,2
             ,'\x02');
  DynamicObject::SetHasNoEnumerableProperties(proxyConstructor,true);
  return true;
}

Assistant:

bool JavascriptLibrary::InitializeProxyConstructor(DynamicObject* proxyConstructor, DeferredTypeHandlerBase * typeHandler, DeferredInitializeMode mode)
    {
        typeHandler->Convert(proxyConstructor, mode, 4);
        // Note: Any new function addition/deletion/modification should also be updated in JavascriptLibrary::ProfilerRegisterSymbol
        // so that the update is in sync with profiler
        JavascriptLibrary* library = proxyConstructor->GetLibrary();
        ScriptContext* scriptContext = proxyConstructor->GetScriptContext();
        library->AddMember(proxyConstructor, PropertyIds::length, TaggedInt::ToVarUnchecked(2), PropertyConfigurable);
        library->AddMember(proxyConstructor, PropertyIds::name, scriptContext->GetPropertyString(PropertyIds::Proxy), PropertyConfigurable);

        library->AddFunctionToLibraryObject(proxyConstructor, PropertyIds::revocable, &JavascriptProxy::EntryInfo::Revocable, 2, PropertyConfigurable);

        proxyConstructor->SetHasNoEnumerableProperties(true);

        return true;
    }